

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

ON_3dVector * __thiscall ON_3dVector::operator=(ON_3dVector *this,double *v)

{
  undefined4 uVar1;
  undefined4 uVar2;
  
  if (v == (double *)0x0) {
    this->x = 0.0;
    this->y = 0.0;
    uVar1 = 0;
    uVar2 = 0;
  }
  else {
    this->x = *v;
    this->y = v[1];
    uVar1 = SUB84(v[2],0);
    uVar2 = (undefined4)((ulong)v[2] >> 0x20);
  }
  this->z = (double)CONCAT44(uVar2,uVar1);
  return this;
}

Assistant:

ON_3dVector& ON_3dVector::operator=(const double* v)
{
  if ( v ) {
    x = v[0];
    y = v[1];
    z = v[2];
  }
  else {
    x = y = z = 0.0;
  }
  return *this;
}